

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(long lhs,SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  long ret;
  unsigned_long local_30 [3];
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_18;
  
  local_30[1] = 0;
  local_30[0] = rhs.m_int;
  local_30[2] = lhs;
  DivisionHelper<long,_unsigned_long,_3>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            ((long *)(local_30 + 2),local_30,(long *)(local_30 + 1));
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<long>
            (&local_18,(long *)(local_30 + 1));
  return (SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>)
         local_18.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}